

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall cmCacheManager::PrintCache(cmCacheManager *this,ostream *out)

{
  undefined8 in_RAX;
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"=================================================\nCMakeCache Contents:\n",0x47);
  p_Var2 = (this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->Cache)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      if (p_Var2[3]._M_color != 4) {
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,*(char **)(p_Var2 + 2),(long)p_Var2[2]._M_parent);
        uStack_38 = CONCAT17(10,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 7),1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "\n\nTo change values in the CMakeCache, \nedit CMakeCache.txt in your output directory.\n=================================================\n"
             ,0x87);
  return;
}

Assistant:

void cmCacheManager::PrintCache(std::ostream& out) const
{
  out << "=================================================\n"
         "CMakeCache Contents:\n";
  for (auto const& i : this->Cache) {
    if (i.second.Type != cmStateEnums::INTERNAL) {
      out << i.first << " = " << i.second.Value << '\n';
    }
  }
  out << "\n\n"
         "To change values in the CMakeCache, \n"
         "edit CMakeCache.txt in your output directory.\n"
         "=================================================\n";
}